

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void KYBER_encap_external_entropy
               (uint8_t *out_ciphertext,uint8_t *out_shared_secret,KYBER_public_key *public_key,
               uint8_t *entropy)

{
  public_key *pub_00;
  uint8_t local_b8 [8];
  uint8_t prekey_and_randomness [64];
  uint8_t input [64];
  public_key *pub;
  uint8_t *entropy_local;
  KYBER_public_key *public_key_local;
  uint8_t *out_shared_secret_local;
  uint8_t *out_ciphertext_local;
  
  pub_00 = anon_unknown.dwarf_6e030f::public_key_from_external(public_key);
  OPENSSL_memcpy(prekey_and_randomness + 0x38,entropy,0x20);
  OPENSSL_memcpy(input + 0x18,pub_00->public_key_hash,0x20);
  hash_g(local_b8,prekey_and_randomness + 0x38,0x40);
  encrypt_cpa(out_ciphertext,pub_00,entropy,prekey_and_randomness + 0x18);
  hash_h(prekey_and_randomness + 0x18,out_ciphertext,0x440);
  kdf(out_shared_secret,0x20,local_b8,0x40);
  return;
}

Assistant:

void KYBER_encap_external_entropy(
    uint8_t out_ciphertext[KYBER_CIPHERTEXT_BYTES],
    uint8_t out_shared_secret[KYBER_SHARED_SECRET_BYTES],
    const struct KYBER_public_key *public_key,
    const uint8_t entropy[KYBER_ENCAP_ENTROPY]) {
  const struct public_key *pub = public_key_from_external(public_key);
  uint8_t input[64];
  OPENSSL_memcpy(input, entropy, KYBER_ENCAP_ENTROPY);
  OPENSSL_memcpy(input + KYBER_ENCAP_ENTROPY, pub->public_key_hash,
                 sizeof(input) - KYBER_ENCAP_ENTROPY);
  uint8_t prekey_and_randomness[64];
  hash_g(prekey_and_randomness, input, sizeof(input));
  encrypt_cpa(out_ciphertext, pub, entropy, prekey_and_randomness + 32);
  // The ciphertext is public.
  CONSTTIME_DECLASSIFY(out_ciphertext, KYBER_CIPHERTEXT_BYTES);
  hash_h(prekey_and_randomness + 32, out_ciphertext, KYBER_CIPHERTEXT_BYTES);
  kdf(out_shared_secret, KYBER_SHARED_SECRET_BYTES, prekey_and_randomness,
      sizeof(prekey_and_randomness));
}